

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  size_t sVar1;
  ostream *poVar2;
  allocator<char> local_81;
  string local_80 [36];
  int local_5c;
  int local_58;
  int x_1;
  int i_1;
  int x;
  int i;
  int local_3c;
  int local_38;
  int m;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  
  pq._28_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)&n,(less<int> *)((long)&m + 3));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_38);
  std::istream::operator>>(this,&local_3c);
  for (i_1 = 0; i_1 < local_38; i_1 = i_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x_1);
    CP::priority_queue<int,_std::less<int>_>::push((priority_queue<int,_std::less<int>_> *)&n,&x_1);
  }
  for (local_58 = 0; local_58 < local_3c; local_58 = local_58 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_5c);
    sVar1 = CP::priority_queue<int,_std::less<int>_>::get_rank
                      ((priority_queue<int,_std::less<int>_> *)&n,(long)local_5c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"\n",&local_81);
    std::operator<<(poVar2,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)&n);
  return pq._28_4_;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(0);

  CP::priority_queue<int> pq;
  int n,m;
  std::cin >> n >> m;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    pq.push(x);
  }

  for (int i = 0;i < m;i++) {
    int x;
    std::cin >> x;
    std::cout << pq.get_rank(x) << std::endl;
  }
  
}